

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

GLuint gl3cts::TransformFeedback::Utilities::buildProgram
                 (Functions *gl,TestLog *log,GLchar *geometry_shader_source,
                 GLchar *tessellation_control_shader_source,
                 GLchar *tessellation_evaluation_shader_source,GLchar *vertex_shader_source,
                 GLchar *fragment_shader_source,GLchar **transform_feedback_varyings,
                 GLsizei transform_feedback_varyings_count,GLenum transform_feedback_varyings_mode,
                 bool do_not_detach,GLint *linking_status)

{
  ostringstream *poVar1;
  GLint GVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLuint GVar5;
  char *pcVar6;
  MessageBuilder *this;
  undefined4 *puVar7;
  long lVar8;
  char **value;
  GLint status_1;
  GLint log_size;
  TestLog *local_220;
  Shader shader [5];
  GLint status;
  uint uStack_1bc;
  int local_1b8;
  undefined1 local_1b0 [384];
  
  shader[0].type = 0x8dd9;
  shader[0].id = 0;
  shader[1].type = 0x8e88;
  shader[1].id = 0;
  shader[2].type = 0x8e87;
  shader[2].id = 0;
  shader[3].type = 0x8b31;
  shader[3].id = 0;
  shader[4].source = fragment_shader_source;
  shader[4].type = 0x8b30;
  shader[4].id = 0;
  local_220 = log;
  shader[0].source = geometry_shader_source;
  shader[1].source = tessellation_control_shader_source;
  shader[2].source = tessellation_evaluation_shader_source;
  shader[3].source = vertex_shader_source;
  GVar3 = (*gl->createProgram)();
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1a24);
  for (lVar8 = 0; lVar8 != 0x50; lVar8 = lVar8 + 0x10) {
    if (*(long *)((long)&shader[0].source + lVar8) != 0) {
      GVar5 = (*gl->createShader)(*(GLenum *)((long)&shader[0].type + lVar8));
      *(GLuint *)((long)&shader[0].id + lVar8) = GVar5;
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a2e);
      (*gl->attachShader)(GVar3,*(GLuint *)((long)&shader[0].id + lVar8));
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a32);
      value = (char **)((long)&shader[0].source + lVar8);
      (*gl->shaderSource)(*(GLuint *)((long)&shader[0].id + lVar8),1,value,(GLint *)0x0);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a36);
      (*gl->compileShader)(*(GLuint *)((long)&shader[0].id + lVar8));
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a3a);
      status_1 = 0;
      (*gl->getShaderiv)(*(GLuint *)((long)&shader[0].id + lVar8),0x8b81,&status_1);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a3f);
      if (status_1 == 0) {
        log_size = 0;
        (*gl->getShaderiv)(*(GLuint *)((long)&shader[0].id + lVar8),0x8b84,&log_size);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x1a45);
        GVar2 = log_size;
        pcVar6 = (char *)operator_new__((long)log_size);
        (*gl->getShaderInfoLog)
                  (*(GLuint *)((long)&shader[0].id + lVar8),GVar2,(GLsizei *)0x0,pcVar6);
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = local_220;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Shader compilation has failed.\n");
        std::operator<<((ostream *)poVar1,"Shader type: ");
        local_1b8 = *(int *)((long)&shader[0].type + lVar8);
        _status = glu::getShaderTypeName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&status,(ostream *)poVar1);
        std::operator<<((ostream *)poVar1,"\n");
        std::operator<<((ostream *)poVar1,"Shader compilation error log:\n");
        std::operator<<((ostream *)poVar1,pcVar6);
        std::operator<<((ostream *)poVar1,"\n");
        std::operator<<((ostream *)poVar1,"Shader source code:\n");
        this = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
        std::operator<<(&(this->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n");
        tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        operator_delete__(pcVar6);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x1a55);
        puVar7 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar7 = 0;
        __cxa_throw(puVar7,&int::typeinfo,0);
      }
    }
  }
  if (transform_feedback_varyings_count != 0) {
    (*gl->transformFeedbackVaryings)
              (GVar3,transform_feedback_varyings_count,transform_feedback_varyings,
               transform_feedback_varyings_mode);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glTransformFeedbackVaryings call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1a61);
  }
  (*gl->linkProgram)(GVar3);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1a66);
  _status = (code *)((ulong)uStack_1bc << 0x20);
  (*gl->getProgramiv)(GVar3,0x8b82,&status);
  if (linking_status != (GLint *)0x0) {
    *linking_status = status;
  }
  if (status == 1) {
    if (!do_not_detach) {
      for (lVar8 = 0xc; lVar8 != 0x5c; lVar8 = lVar8 + 0x10) {
        GVar5 = *(GLuint *)((long)&shader[0].source + lVar8);
        if (GVar5 != 0) {
          (*gl->detachShader)(GVar3,GVar5);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,"glDetachShader call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x1a7b);
        }
      }
    }
    for (lVar8 = 0xc; lVar8 != 0x5c; lVar8 = lVar8 + 0x10) {
      GVar5 = *(GLuint *)((long)&shader[0].source + lVar8);
      if (GVar5 != 0) {
        (*gl->deleteShader)(GVar5);
        *(undefined4 *)((long)&shader[0].source + lVar8) = 0;
      }
    }
    return GVar3;
  }
  status_1 = 0;
  (*gl->getProgramiv)(GVar3,0x8b84,&status_1);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1a86);
  GVar2 = status_1;
  pcVar6 = (char *)operator_new__((long)status_1);
  (*gl->getProgramInfoLog)(GVar3,GVar2,(GLsizei *)0x0,pcVar6);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = local_220;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Program linkage has failed due to:\n");
  std::operator<<((ostream *)poVar1,pcVar6);
  std::operator<<((ostream *)poVar1,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  operator_delete__(pcVar6);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1a92);
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

glw::GLuint gl3cts::TransformFeedback::Utilities::buildProgram(
	glw::Functions const& gl, tcu::TestLog& log, glw::GLchar const* const geometry_shader_source,
	glw::GLchar const* const tessellation_control_shader_source,
	glw::GLchar const* const tessellation_evaluation_shader_source, glw::GLchar const* const vertex_shader_source,
	glw::GLchar const* const fragment_shader_source, glw::GLchar const* const* const transform_feedback_varyings,
	glw::GLsizei const transform_feedback_varyings_count, glw::GLenum const transform_feedback_varyings_mode,
	bool const do_not_detach, glw::GLint* linking_status)
{
	glw::GLuint program = 0;

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { geometry_shader_source, GL_GEOMETRY_SHADER, 0 },
				   { tessellation_control_shader_source, GL_TESS_CONTROL_SHADER, 0 },
				   { tessellation_evaluation_shader_source, GL_TESS_EVALUATION_SHADER, 0 },
				   { vertex_shader_source, GL_VERTEX_SHADER, 0 },
				   { fragment_shader_source, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		program = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(program, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					log << tcu::TestLog::Message << "Shader compilation has failed.\n"
						<< "Shader type: " << glu::getShaderTypeStr(shader[i].type) << "\n"
						<< "Shader compilation error log:\n"
						<< log_text << "\n"
						<< "Shader source code:\n"
						<< shader[i].source << "\n"
						<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		if (transform_feedback_varyings_count)
		{
			gl.transformFeedbackVaryings(program, transform_feedback_varyings_count, transform_feedback_varyings,
										 transform_feedback_varyings_mode);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");
		}

		gl.linkProgram(program);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(program, GL_LINK_STATUS, &status);

		if (DE_NULL != linking_status)
		{
			*linking_status = status;
		}

		if (GL_TRUE == status)
		{
			if (!do_not_detach)
			{
				for (glw::GLuint i = 0; i < shader_count; ++i)
				{
					if (shader[i].id)
					{
						gl.detachShader(program, shader[i].id);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
					}
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(program, log_size, NULL, &log_text[0]);

			log << tcu::TestLog::Message << "Program linkage has failed due to:\n"
				<< log_text << "\n"
				<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (program)
		{
			gl.deleteProgram(program);

			program = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	return program;
}